

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

int ON_wString::MapStringOrdinal
              (ON_StringMapOrdinalType map_type,wchar_t *string,int element_count,
              wchar_t *mapped_string,int mapped_string_capacity)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  
  if (mapped_string_capacity != 0) {
    if (mapped_string_capacity < 1 || mapped_string == (wchar_t *)0x0) {
      return 0;
    }
    if (string != mapped_string) {
      *mapped_string = L'\0';
    }
  }
  if (element_count < 0) {
    element_count = Length(string);
    if (element_count < 0) {
      return 0;
    }
    if (mapped_string_capacity == 0) {
      return element_count + 1;
    }
  }
  else if (mapped_string_capacity == 0) {
    return element_count;
  }
  if (mapped_string_capacity < element_count) {
    return 0;
  }
  if (element_count != 0) {
    pwVar1 = string + (uint)element_count;
    do {
      wVar2 = *string;
      string = string + 1;
      wVar2 = MapCodePointOrdinal(wVar2,0xffff,map_type);
      *mapped_string = wVar2;
      mapped_string = mapped_string + 1;
    } while (string < pwVar1);
  }
  if (element_count < mapped_string_capacity) {
    *mapped_string = L'\0';
    return element_count;
  }
  return element_count;
}

Assistant:

int ON_wString::MapStringOrdinal(
  ON_StringMapOrdinalType map_type,
  const wchar_t* string,
  int element_count,
  wchar_t* mapped_string,
  int mapped_string_capacity
  )
{
  if (0 != mapped_string_capacity)
  {
    if (nullptr == mapped_string || mapped_string_capacity <= 0)
      return 0;

    if (string != mapped_string)
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_wString::Length(string);
    if (element_count < 0)
      return 0;
    if ( 0 == mapped_string_capacity )
      return element_count+1; // +1 for null terminator
  }
  else if ( 0 == mapped_string_capacity )
    return element_count; // no +1 here

  if ( element_count > mapped_string_capacity )
    return 0;

  const wchar_t* s1 = string + element_count;
  while (string < s1)
    *mapped_string++ = ON_wString::MapCharacterOrdinal(map_type,*string++);

  if ( element_count < mapped_string_capacity )
    *mapped_string = 0;

  return element_count;
}